

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.h
# Opt level: O1

void __thiscall
cmMakefileProfilingData::RAII::RAII<char_const(&)[8],char_const(&)[9]>
          (RAII *this,cmMakefileProfilingData *data,char (*args) [8],char (*args_1) [9])

{
  size_t sVar1;
  string local_90;
  string local_70;
  optional<Json::Value> local_50;
  
  this->Data = data;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,args,*args + sVar1);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  sVar1 = strlen(*args_1);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,args_1,*args_1 + sVar1);
  local_50.super__Optional_base<Json::Value,_false,_false>._M_payload.
  super__Optional_payload<Json::Value,_true,_false,_false>.super__Optional_payload_base<Json::Value>
  ._M_engaged = false;
  StartEntry(data,&local_70,&local_90,&local_50);
  if (local_50.super__Optional_base<Json::Value,_false,_false>._M_payload.
      super__Optional_payload<Json::Value,_true,_false,_false>.
      super__Optional_payload_base<Json::Value>._M_engaged == true) {
    local_50.super__Optional_base<Json::Value,_false,_false>._M_payload.
    super__Optional_payload<Json::Value,_true,_false,_false>.
    super__Optional_payload_base<Json::Value>._M_engaged = false;
    Json::Value::~Value((Value *)&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

RAII(cmMakefileProfilingData& data, Args&&... args)
      : Data(&data)
    {
      this->Data->StartEntry(std::forward<Args>(args)...);
    }